

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32c_portable.cc
# Opt level: O1

uint32_t crc32c::ExtendPortable(uint32_t crc,uint8_t *data,size_t size)

{
  uint uVar1;
  uint *puVar2;
  long lVar3;
  uint *puVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint *puVar9;
  uint *puVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  long in_FS_OFFSET;
  
  puVar4 = (uint *)(data + size);
  uVar7 = (ulong)~crc;
  puVar2 = (uint *)((ulong)(data + 3) & 0xfffffffffffffffc);
  puVar9 = (uint *)data;
  if ((long)puVar2 - (long)data != 0 && puVar2 <= puVar4) {
    do {
      puVar10 = (uint *)((long)puVar9 + 1);
      uVar7 = (ulong)((uint)(uVar7 >> 8) ^
                     *(uint *)(::(anonymous_namespace)::kByteExtensionTable +
                              (ulong)((uint)(byte)*puVar9 ^ (uint)uVar7 & 0xff) * 4));
      puVar9 = puVar10;
    } while (puVar10 != puVar2);
    data = data + ((long)puVar2 - (long)data);
  }
  if (0xf < (long)puVar4 - (long)data) {
    uVar5 = (uint)uVar7 ^ *(uint *)data;
    uVar6 = *(uint *)((long)data + 4);
    uVar15 = *(uint *)((long)data + 8);
    uVar12 = *(uint *)((long)data + 0xc);
    data = (uint8_t *)((long)data + 0x10);
    for (lVar3 = (long)puVar4 - (long)data; 0x100 < lVar3; lVar3 = lVar3 + -0x40) {
      uVar5 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 + (ulong)(uVar5 & 0xff) * 4)
              ^ *(uint *)data ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                       (ulong)(uVar5 >> 8 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar5 >> 0xe & 0x3fc)) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 + (ulong)(uVar5 >> 0x18) * 4
                       );
      uVar6 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 + (ulong)(uVar6 & 0xff) * 4)
              ^ *(uint *)((long)data + 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                       (ulong)(uVar6 >> 8 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar6 >> 0xe & 0x3fc)) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 + (ulong)(uVar6 >> 0x18) * 4
                       );
      uVar15 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 +
                        (ulong)(uVar15 & 0xff) * 4) ^ *(uint *)((long)data + 8) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                        (ulong)(uVar15 >> 8 & 0xff) * 4) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar15 >> 0xe & 0x3fc))
               ^ *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 +
                          (ulong)(uVar15 >> 0x18) * 4);
      uVar12 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 +
                        (ulong)(uVar12 & 0xff) * 4) ^ *(uint *)((long)data + 0xc) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                        (ulong)(uVar12 >> 8 & 0xff) * 4) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar12 >> 0xe & 0x3fc))
               ^ *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 +
                          (ulong)(uVar12 >> 0x18) * 4);
      uVar5 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 + (ulong)(uVar5 & 0xff) * 4)
              ^ *(uint *)((long)data + 0x10) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                       (ulong)(uVar5 >> 8 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar5 >> 0xe & 0x3fc)) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 + (ulong)(uVar5 >> 0x18) * 4
                       );
      uVar6 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 + (ulong)(uVar6 & 0xff) * 4)
              ^ *(uint *)((long)data + 0x14) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                       (ulong)(uVar6 >> 8 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar6 >> 0xe & 0x3fc)) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 + (ulong)(uVar6 >> 0x18) * 4
                       );
      uVar15 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 +
                        (ulong)(uVar15 & 0xff) * 4) ^ *(uint *)((long)data + 0x18) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                        (ulong)(uVar15 >> 8 & 0xff) * 4) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar15 >> 0xe & 0x3fc))
               ^ *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 +
                          (ulong)(uVar15 >> 0x18) * 4);
      uVar12 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 +
                        (ulong)(uVar12 & 0xff) * 4) ^ *(uint *)((long)data + 0x1c) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                        (ulong)(uVar12 >> 8 & 0xff) * 4) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar12 >> 0xe & 0x3fc))
               ^ *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 +
                          (ulong)(uVar12 >> 0x18) * 4);
      uVar5 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 + (ulong)(uVar5 & 0xff) * 4)
              ^ *(uint *)((long)data + 0x20) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                       (ulong)(uVar5 >> 8 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar5 >> 0xe & 0x3fc)) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 + (ulong)(uVar5 >> 0x18) * 4
                       );
      uVar6 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 + (ulong)(uVar6 & 0xff) * 4)
              ^ *(uint *)((long)data + 0x24) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                       (ulong)(uVar6 >> 8 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar6 >> 0xe & 0x3fc)) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 + (ulong)(uVar6 >> 0x18) * 4
                       );
      uVar15 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 +
                        (ulong)(uVar15 & 0xff) * 4) ^ *(uint *)((long)data + 0x28) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                        (ulong)(uVar15 >> 8 & 0xff) * 4) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar15 >> 0xe & 0x3fc))
               ^ *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 +
                          (ulong)(uVar15 >> 0x18) * 4);
      uVar12 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 +
                        (ulong)(uVar12 & 0xff) * 4) ^ *(uint *)((long)data + 0x2c) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                        (ulong)(uVar12 >> 8 & 0xff) * 4) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar12 >> 0xe & 0x3fc))
               ^ *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 +
                          (ulong)(uVar12 >> 0x18) * 4);
      uVar5 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 + (ulong)(uVar5 & 0xff) * 4)
              ^ *(uint *)((long)data + 0x30) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                       (ulong)(uVar5 >> 8 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar5 >> 0xe & 0x3fc)) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 + (ulong)(uVar5 >> 0x18) * 4
                       );
      uVar6 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 + (ulong)(uVar6 & 0xff) * 4)
              ^ *(uint *)((long)data + 0x34) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                       (ulong)(uVar6 >> 8 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar6 >> 0xe & 0x3fc)) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 + (ulong)(uVar6 >> 0x18) * 4
                       );
      uVar15 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 +
                        (ulong)(uVar15 & 0xff) * 4) ^ *(uint *)((long)data + 0x38) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                        (ulong)(uVar15 >> 8 & 0xff) * 4) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar15 >> 0xe & 0x3fc))
               ^ *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 +
                          (ulong)(uVar15 >> 0x18) * 4);
      uVar12 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 +
                        (ulong)(uVar12 & 0xff) * 4) ^ *(uint *)((long)data + 0x3c) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                        (ulong)(uVar12 >> 8 & 0xff) * 4) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar12 >> 0xe & 0x3fc))
               ^ *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 +
                          (ulong)(uVar12 >> 0x18) * 4);
      data = (uint8_t *)((long)data + 0x40);
    }
    for (lVar3 = (long)puVar4 - (long)data; 0xf < lVar3; lVar3 = lVar3 + -0x10) {
      uVar5 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 + (ulong)(uVar5 & 0xff) * 4)
              ^ *(uint *)data ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                       (ulong)(uVar5 >> 8 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar5 >> 0xe & 0x3fc)) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 + (ulong)(uVar5 >> 0x18) * 4
                       );
      uVar6 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 + (ulong)(uVar6 & 0xff) * 4)
              ^ *(uint *)((long)data + 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                       (ulong)(uVar6 >> 8 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar6 >> 0xe & 0x3fc)) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 + (ulong)(uVar6 >> 0x18) * 4
                       );
      uVar15 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 +
                        (ulong)(uVar15 & 0xff) * 4) ^ *(uint *)((long)data + 8) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                        (ulong)(uVar15 >> 8 & 0xff) * 4) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar15 >> 0xe & 0x3fc))
               ^ *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 +
                          (ulong)(uVar15 >> 0x18) * 4);
      uVar12 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 +
                        (ulong)(uVar12 & 0xff) * 4) ^ *(uint *)((long)data + 0xc) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                        (ulong)(uVar12 >> 8 & 0xff) * 4) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar12 >> 0xe & 0x3fc))
               ^ *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 +
                          (ulong)(uVar12 >> 0x18) * 4);
      data = (uint8_t *)((long)data + 0x10);
    }
    for (lVar3 = (long)puVar4 - (long)data; 3 < lVar3; lVar3 = lVar3 + -4) {
      uVar8 = uVar5 & 0xff;
      uVar1 = *(uint *)data;
      uVar13 = uVar5 >> 8;
      uVar14 = uVar5 >> 0xe;
      uVar11 = uVar5 >> 0x18;
      data = (uint8_t *)((long)data + 4);
      uVar5 = uVar6;
      uVar6 = uVar15;
      uVar15 = uVar12;
      uVar12 = *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 + (ulong)uVar8 * 4) ^ uVar1
               ^ *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                          (ulong)(uVar13 & 0xff) * 4) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 + (uVar14 & 0x3fc)) ^
               *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 + (ulong)uVar11 * 4);
    }
    lVar3 = 4;
    do {
      uVar5 = uVar5 >> 8 ^
              *(uint *)(::(anonymous_namespace)::kByteExtensionTable + ((ulong)uVar5 & 0xff) * 4);
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
    uVar5 = uVar5 ^ uVar6;
    lVar3 = 4;
    do {
      uVar5 = uVar5 >> 8 ^
              *(uint *)(::(anonymous_namespace)::kByteExtensionTable + (ulong)(uVar5 & 0xff) * 4);
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
    uVar5 = uVar5 ^ uVar15;
    lVar3 = 4;
    do {
      uVar5 = uVar5 >> 8 ^
              *(uint *)(::(anonymous_namespace)::kByteExtensionTable + (ulong)(uVar5 & 0xff) * 4);
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
    uVar7 = (ulong)(uVar5 ^ uVar12);
    lVar3 = 4;
    do {
      uVar7 = (ulong)((uint)(uVar7 >> 8) ^
                     *(uint *)(::(anonymous_namespace)::kByteExtensionTable + (uVar7 & 0xff) * 4));
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  uVar6 = (uint)uVar7;
  for (; (uint *)data != puVar4; data = (uint8_t *)((long)data + 1)) {
    uVar6 = (uint)(uVar7 >> 8) ^
            *(uint *)(::(anonymous_namespace)::kByteExtensionTable +
                     (ulong)((uint)(byte)*(uint *)data ^ (uint)uVar7 & 0xff) * 4);
    uVar7 = (ulong)uVar6;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return ~uVar6;
}

Assistant:

uint32_t ExtendPortable(uint32_t crc, const uint8_t* data, size_t size) {
  const uint8_t* p = data;
  const uint8_t* e = p + size;
  uint32_t l = crc ^ kCRC32Xor;

// Process one byte at a time.
#define STEP1                              \
  do {                                     \
    int c = (l & 0xff) ^ *p++;             \
    l = kByteExtensionTable[c] ^ (l >> 8); \
  } while (0)

// Process one of the 4 strides of 4-byte data.
#define STEP4(s)                                                               \
  do {                                                                         \
    crc##s = ReadUint32LE(p + s * 4) ^ kStrideExtensionTable3[crc##s & 0xff] ^ \
             kStrideExtensionTable2[(crc##s >> 8) & 0xff] ^                    \
             kStrideExtensionTable1[(crc##s >> 16) & 0xff] ^                   \
             kStrideExtensionTable0[crc##s >> 24];                             \
  } while (0)

// Process a 16-byte swath of 4 strides, each of which has 4 bytes of data.
#define STEP16 \
  do {         \
    STEP4(0);  \
    STEP4(1);  \
    STEP4(2);  \
    STEP4(3);  \
    p += 16;   \
  } while (0)

// Process 4 bytes that were already loaded into a word.
#define STEP4W(w)                                   \
  do {                                              \
    w ^= l;                                         \
    for (size_t i = 0; i < 4; ++i) {                \
      w = (w >> 8) ^ kByteExtensionTable[w & 0xff]; \
    }                                               \
    l = w;                                          \
  } while (0)

  // Point x at first 4-byte aligned byte in the buffer. This might be past the
  // end of the buffer.
  const uint8_t* x = RoundUp<4>(p);
  if (x <= e) {
    // Process bytes p is 4-byte aligned.
    while (p != x) {
      STEP1;
    }
  }

  if ((e - p) >= 16) {
    // Load a 16-byte swath into the stride partial results.
    uint32_t crc0 = ReadUint32LE(p + 0 * 4) ^ l;
    uint32_t crc1 = ReadUint32LE(p + 1 * 4);
    uint32_t crc2 = ReadUint32LE(p + 2 * 4);
    uint32_t crc3 = ReadUint32LE(p + 3 * 4);
    p += 16;

    while ((e - p) > kPrefetchHorizon) {
      RequestPrefetch(p + kPrefetchHorizon);

      // Process 64 bytes at a time.
      STEP16;
      STEP16;
      STEP16;
      STEP16;
    }

    // Process one 16-byte swath at a time.
    while ((e - p) >= 16) {
      STEP16;
    }

    // Advance one word at a time as far as possible.
    while ((e - p) >= 4) {
      STEP4(0);
      uint32_t tmp = crc0;
      crc0 = crc1;
      crc1 = crc2;
      crc2 = crc3;
      crc3 = tmp;
      p += 4;
    }

    // Combine the 4 partial stride results.
    l = 0;
    STEP4W(crc0);
    STEP4W(crc1);
    STEP4W(crc2);
    STEP4W(crc3);
  }

  // Process the last few bytes.
  while (p != e) {
    STEP1;
  }
#undef STEP4W
#undef STEP16
#undef STEP4
#undef STEP1
  return l ^ kCRC32Xor;
}